

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O0

quint16 QDnsLookup::defaultPortForProtocol(Protocol protocol)

{
  Protocol protocol_local;
  undefined2 local_2;
  
  if (protocol == Standard) {
    local_2 = 0x35;
  }
  else if (protocol == DnsOverTls) {
    local_2 = 0x355;
  }
  else {
    local_2 = 0;
  }
  return local_2;
}

Assistant:

quint16 QDnsLookup::defaultPortForProtocol(Protocol protocol) noexcept
{
    switch (protocol) {
    case QDnsLookup::Standard:
        return DnsPort;
    case QDnsLookup::DnsOverTls:
        return DnsOverTlsPort;
    }
    return 0;       // will probably fail somewhere
}